

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_value.h
# Opt level: O0

bool Potassco::ProgramOptions::FlagAction::store_false(string *v,bool *b)

{
  bool bVar1;
  byte *in_RSI;
  bool temp;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  byte in_stack_ffffffffffffffef;
  
  bVar1 = store_true((string *)
                     CONCAT17(in_stack_ffffffffffffffef,
                              CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)),
                     (bool *)0x11c87d);
  if (bVar1) {
    *in_RSI = (in_stack_ffffffffffffffef ^ 0xff) & 1;
  }
  return bVar1;
}

Assistant:

static inline bool store_false(const std::string& v, bool& b) {
		bool temp;
		return store_true(v, temp) && ((b = !temp), true);
	}